

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

wint_t ** terminal_alloc_buffer(EditLine *el)

{
  wchar_t wVar1;
  wint_t **__ptr;
  wint_t *pwVar2;
  ulong uVar3;
  ulong uVar4;
  
  wVar1 = (el->el_terminal).t_size.v;
  __ptr = (wint_t **)calloc((long)wVar1 + 1,8);
  uVar4 = 0;
  if (__ptr != (wint_t **)0x0) {
    uVar3 = 0;
    if (L'\0' < wVar1) {
      uVar3 = (ulong)(uint)wVar1;
    }
    while( true ) {
      if (uVar3 == uVar4) {
        __ptr[wVar1] = (wint_t *)0x0;
        return __ptr;
      }
      pwVar2 = (wint_t *)calloc((long)(el->el_terminal).t_size.h + 1,4);
      __ptr[uVar4] = pwVar2;
      if (pwVar2 == (wint_t *)0x0) break;
      uVar4 = uVar4 + 1;
    }
    for (; 0 < (long)uVar4; uVar4 = uVar4 - 1) {
      free(__ptr[uVar4 - 1]);
    }
    free(__ptr);
  }
  return (wint_t **)0x0;
}

Assistant:

static wint_t **
terminal_alloc_buffer(EditLine *el)
{
	wint_t **b;
	coord_t *c = &el->el_terminal.t_size;
	int i;

	b =  el_calloc((size_t)(c->v + 1), sizeof(*b));
	if (b == NULL)
		return NULL;
	for (i = 0; i < c->v; i++) {
		b[i] = el_calloc((size_t)(c->h + 1), sizeof(**b));
		if (b[i] == NULL) {
			while (--i >= 0)
				el_free(b[i]);
			el_free(b);
			return NULL;
		}
	}
	b[c->v] = NULL;
	return b;
}